

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  example *peVar3;
  wclass *pwVar4;
  size_t sVar5;
  uint64_t uVar6;
  wclass *pwVar7;
  wclass *pwVar8;
  example **example;
  pointer ppeVar9;
  iterator __begin1;
  pointer ppeVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  ppeVar10 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar10 == ppeVar2) {
    fVar14 = 3.4028235e+38;
    fVar11 = -3.4028235e+38;
  }
  else {
    fVar11 = -3.4028235e+38;
    fVar14 = 3.4028235e+38;
    ppeVar9 = ppeVar10;
    do {
      fVar1 = (((*ppeVar9)->l).cs.costs._begin)->x;
      fVar13 = fVar1;
      if (fVar14 <= fVar1) {
        fVar13 = fVar14;
      }
      fVar14 = fVar13;
      if (fVar1 <= fVar11) {
        fVar1 = fVar11;
      }
      fVar11 = fVar1;
      ppeVar9 = ppeVar9 + 1;
    } while (ppeVar9 != ppeVar2);
  }
  for (; ppeVar10 != ppeVar2; ppeVar10 = ppeVar10 + 1) {
    peVar3 = *ppeVar10;
    pwVar4 = (peVar3->l).cs.costs._begin;
    sVar5 = (peVar3->l).cs.costs.erase_count;
    pwVar7 = (peVar3->l).cs.costs._end;
    pwVar8 = (peVar3->l).cs.costs.end_array;
    fVar1 = peVar3->weight;
    fVar13 = pwVar4->x;
    if (data->treat_as_classifier == true) {
      fVar12 = fVar13;
      if (fVar14 >= fVar13) {
        fVar12 = fVar11;
      }
      peVar3->weight = (fVar12 - fVar14) * fVar1;
      fVar13 = *(float *)(&DAT_00280dc0 + (ulong)(fVar14 < fVar13) * 4);
    }
    peVar3 = *ppeVar10;
    (peVar3->l).simple.label = fVar13;
    (peVar3->l).simple.initial = 0.0;
    LabelDict::add_example_namespace_from_memory
              (&data->label_features,*ppeVar10,(ulong)pwVar4->class_index);
    uVar6 = ((*ppeVar10)->super_example_predict).ft_offset;
    ((*ppeVar10)->super_example_predict).ft_offset = data->ft_offset;
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),*ppeVar10);
    ((*ppeVar10)->super_example_predict).ft_offset = uVar6;
    LabelDict::del_example_namespace_from_memory
              (&data->label_features,*ppeVar10,(ulong)pwVar4->class_index);
    (*ppeVar10)->weight = fVar1;
    peVar3 = *ppeVar10;
    (peVar3->l).cs.costs._begin = pwVar4;
    (peVar3->l).cs.costs._end = pwVar7;
    (peVar3->l).cs.costs.end_array = pwVar8;
    (peVar3->l).cs.costs.erase_count = sVar5;
    (*ppeVar10)->partial_prediction = pwVar4->partial_prediction;
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (const auto & example : ec_seq)
  {
    float ec_cost = example->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (const auto & ec : ec_seq)
  {
    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}